

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmfref.cpp
# Opt level: O0

void __thiscall CVmObjFrameRef::create_loadctx_obj(CVmObjFrameRef *this,vm_val_t *result)

{
  vm_obj_id_t vVar1;
  vm_frameref_ext *pvVar2;
  undefined8 in_RSI;
  CVmObjFrameRef *in_RDI;
  vm_val_t *unaff_retaddr;
  vm_prop_id_t targprop;
  vm_obj_id_t targobj;
  vm_obj_id_t defobj;
  vm_obj_id_t self;
  vm_val_t *fp;
  vm_frameref_ext *ext;
  undefined2 in_stack_ffffffffffffffd0;
  undefined2 in_stack_ffffffffffffffd2;
  undefined4 in_stack_ffffffffffffffd4;
  
  pvVar2 = get_ext(in_RDI);
  if (pvVar2->fp != (vm_val_t *)0x0) {
    CVmRun::get_self_from_frame
              ((vm_val_t *)
               CONCAT44(in_stack_ffffffffffffffd4,
                        CONCAT22(in_stack_ffffffffffffffd2,in_stack_ffffffffffffffd0)));
    CVmRun::get_defining_obj_from_frame
              ((vm_val_t *)
               CONCAT44(in_stack_ffffffffffffffd4,
                        CONCAT22(in_stack_ffffffffffffffd2,in_stack_ffffffffffffffd0)));
    vVar1 = CVmRun::get_orig_target_obj_from_frame
                      ((vm_val_t *)
                       CONCAT44(in_stack_ffffffffffffffd4,
                                CONCAT22(in_stack_ffffffffffffffd2,in_stack_ffffffffffffffd0)));
    CVmRun::get_target_prop_from_frame
              ((vm_val_t *)
               CONCAT44(vVar1,CONCAT22(in_stack_ffffffffffffffd2,in_stack_ffffffffffffffd0)));
  }
  CVmRun::create_loadctx_obj
            (unaff_retaddr,(vm_obj_id_t)((ulong)in_RDI >> 0x20),(vm_obj_id_t)in_RDI,
             (vm_obj_id_t)((ulong)in_RSI >> 0x20),(vm_prop_id_t)((ulong)in_RSI >> 0x10));
  return;
}

Assistant:

void CVmObjFrameRef::create_loadctx_obj(VMG_ vm_val_t *result)
{
    vm_frameref_ext *ext = get_ext();
    vm_val_t *fp = ext->fp;
    vm_obj_id_t self, defobj, targobj;
    vm_prop_id_t targprop;

    /* retrieve the method context elements */
    if (fp != 0)
    {
        /* get the context elements from the live stack frame */
        self = G_interpreter->get_self_from_frame(vmg_ fp);
        defobj = G_interpreter->get_defining_obj_from_frame(vmg_ fp);
        targobj = G_interpreter->get_orig_target_obj_from_frame(vmg_ fp);
        targprop = G_interpreter->get_target_prop_from_frame(vmg_ fp);
    }
    else
    {
        /* the stack frame has exited, so use our snapshot */
        self = (ext->self.typ == VM_OBJ ? ext->self.val.obj : VM_INVALID_OBJ);
        defobj = ext->defobj;
        targobj = ext->targobj;
        targprop = ext->targprop;
    }

    /* create the context object */
    CVmRun::create_loadctx_obj(vmg_ result, self, defobj, targobj, targprop);
}